

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

size_t obu_memmove(size_t obu_header_size,size_t obu_payload_size,uint8_t *data,size_t data_size)

{
  ulong in_RCX;
  long in_RDX;
  uint64_t in_RSI;
  ulong in_RDI;
  size_t move_size;
  size_t move_src_offset;
  size_t move_dst_offset;
  size_t length_field_size;
  undefined8 local_8;
  
  local_8 = aom_uleb_size_in_bytes(in_RSI);
  if ((in_RCX < in_RSI) || (in_RCX - in_RSI < in_RDI)) {
    local_8 = 0;
  }
  else if (in_RCX - in_RSI < in_RDI + local_8) {
    local_8 = 0;
  }
  else {
    memmove((void *)(in_RDX + in_RDI + local_8),(void *)(in_RDX + in_RDI),in_RSI);
  }
  return local_8;
}

Assistant:

static size_t obu_memmove(size_t obu_header_size, size_t obu_payload_size,
                          uint8_t *data, size_t data_size) {
  const size_t length_field_size = aom_uleb_size_in_bytes(obu_payload_size);
  const size_t move_dst_offset = obu_header_size + length_field_size;
  const size_t move_src_offset = obu_header_size;
  const size_t move_size = obu_payload_size;
  if (move_size > data_size || move_src_offset > data_size - move_size) {
    assert(0 && "obu_memmove: output buffer overflow");
    return 0;
  }
  if (move_dst_offset > data_size - move_size) {
    // Buffer full.
    return 0;
  }
  memmove(data + move_dst_offset, data + move_src_offset, move_size);
  return length_field_size;
}